

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

int __thiscall pbrt::Shape::writeTo(Shape *this,BinaryWriter *binary)

{
  shared_ptr<pbrt::AreaLight> *in_RSI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>_>
  *in_stack_00000008;
  BinaryWriter *in_stack_00000010;
  shared_ptr<pbrt::Material> *in_stack_ffffffffffffff88;
  BinaryWriter *in_stack_ffffffffffffff90;
  BinaryWriter *this_00;
  shared_ptr<pbrt::AreaLight> *in_stack_ffffffffffffffb8;
  BinaryWriter *in_stack_ffffffffffffffc0;
  BinaryWriter *in_stack_ffffffffffffffc8;
  
  std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Material,void>
            ((shared_ptr<pbrt::Entity> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  BinaryWriter::serialize(in_stack_ffffffffffffffc8,(SP *)in_stack_ffffffffffffffc0);
  BinaryWriter::write<int>(in_stack_ffffffffffffff90,(int *)in_stack_ffffffffffffff88);
  std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x1275ad);
  BinaryWriter::write<std::__cxx11::string,pbrt::Texture>(in_stack_00000010,in_stack_00000008);
  this_00 = (BinaryWriter *)&stack0xffffffffffffffb8;
  std::shared_ptr<pbrt::AreaLight>::shared_ptr((shared_ptr<pbrt::AreaLight> *)this_00,in_RSI);
  BinaryWriter::write<pbrt::AreaLight>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::shared_ptr<pbrt::AreaLight>::~shared_ptr((shared_ptr<pbrt::AreaLight> *)0x1275fb);
  BinaryWriter::write<signed_char>(this_00,(char *)in_RSI);
  BinaryWriter::write<float>(this_00,(float *)in_RSI);
  return 3;
}

Assistant:

int Shape::writeTo(BinaryWriter &binary) 
  {
    binary.write(binary.serialize(material));
    binary.write(textures);
    binary.write(areaLight);
    binary.write((int8_t)reverseOrientation);
    binary.write(alpha);
    return TYPE_SHAPE;
  }